

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerSafe::GetCommissionerDataset
          (CommissionerSafe *this,Handler<CommissionerDataset> *aHandler,uint16_t aDatasetFlags)

{
  anon_class_48_3_e6543253 local_70;
  AsyncRequest local_40;
  uint16_t local_1a;
  Handler<CommissionerDataset> *pHStack_18;
  uint16_t aDatasetFlags_local;
  Handler<CommissionerDataset> *aHandler_local;
  CommissionerSafe *this_local;
  
  local_70.this = this;
  local_1a = aDatasetFlags;
  pHStack_18 = aHandler;
  aHandler_local = (Handler<CommissionerDataset> *)this;
  std::function<void_(const_ot::commissioner::CommissionerDataset_*,_ot::commissioner::Error)>::
  function(&local_70.aHandler,aHandler);
  local_70.aDatasetFlags = local_1a;
  std::function<void()>::
  function<ot::commissioner::CommissionerSafe::GetCommissionerDataset(std::function<void(ot::commissioner::CommissionerDataset_const*,ot::commissioner::Error)>,unsigned_short)::__0,void>
            ((function<void()> *)&local_40,&local_70);
  PushAsyncRequest(this,&local_40);
  std::function<void_()>::~function(&local_40);
  GetCommissionerDataset(std::function<void(ot::commissioner::CommissionerDataset_const*,ot::commissioner::Error)>,unsigned_short)
  ::$_0::~__0((__0 *)&local_70);
  return;
}

Assistant:

void CommissionerSafe::GetCommissionerDataset(Handler<CommissionerDataset> aHandler, uint16_t aDatasetFlags)
{
    PushAsyncRequest([=]() { mImpl->GetCommissionerDataset(aHandler, aDatasetFlags); });
}